

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap_string.hpp
# Opt level: O0

storage_t *
jsoncons::utility::
launder_cast<jsoncons::utility::heap_string_factory<wchar_t,jsoncons::null_type,std::allocator<wchar_t>>::storage_t*,char>
          (char *u)

{
  storage_t *psVar1;
  storage_t *in_RDI;
  
  psVar1 = std::
           launder<jsoncons::utility::heap_string_factory<wchar_t,jsoncons::null_type,std::allocator<wchar_t>>::storage_t>
                     (in_RDI);
  return psVar1;
}

Assistant:

T launder_cast(U* u)
    {
    #if defined(__cpp_lib_launder) && __cpp_lib_launder >= 201606
        return std::launder(reinterpret_cast<T>(u));
    #elif defined(__GNUC__) &&  (__GNUC__ * 100 + __GNUC_MINOR__) > 800
        return __builtin_launder(reinterpret_cast<T>(u));
    #else
        return reinterpret_cast<T>(u);
    #endif
    }